

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::ComputeAverageFPM
          (ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this)

{
  element_type *peVar1;
  undefined8 uVar2;
  double local_70;
  undefined8 local_68;
  undefined8 local_60;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
  local_50;
  
  local_70 = 0.5;
  uVar2 = (**(code **)(*(long *)(this->section_fpmA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x1b8))();
  local_60 = (**(code **)(*(long *)(this->section_fpmB).
                                   super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 0x1b8))();
  local_68 = uVar2;
  Eigen::operator*(&local_50,&local_70,(StorageBaseType *)&local_68);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,1,6,6>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,6,1,6,6>const,Eigen::Matrix<double,6,6,1,6,6>const>const>>
            (&this->average_fpm,&local_50);
  peVar1 = (this->super_ChBeamSectionTaperedTimoshenkoAdvancedGeneric).avg_sec_par.
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = peVar1->EA;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = peVar1->GAyy;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = peVar1->GAzz;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = peVar1->GJ;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = peVar1->EIyy;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = peVar1->EIzz;
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::ComputeAverageFPM() {
    // the elements off the diagonal are averaged by arithmetic mean
    this->average_fpm =
        0.5 * (this->section_fpmA->GetStiffnessMatrixFPM() + this->section_fpmB->GetStiffnessMatrixFPM());

    // The diagonal terms are averaged by geometrical mean, to be consistent with previous algorithm
    this->average_fpm(0, 0) = this->avg_sec_par->EA;
    this->average_fpm(1, 1) = this->avg_sec_par->GAyy;
    this->average_fpm(2, 2) = this->avg_sec_par->GAzz;
    this->average_fpm(3, 3) = this->avg_sec_par->GJ;
    this->average_fpm(4, 4) = this->avg_sec_par->EIyy;
    this->average_fpm(5, 5) = this->avg_sec_par->EIzz;
}